

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O0

bool __thiscall
vkb::PhysicalDevice::enable_features_if_present
          (PhysicalDevice *this,VkPhysicalDeviceFeatures *features_to_enable)

{
  VkPhysicalDeviceFeatures src;
  undefined8 requested;
  bool bVar1;
  VulkanFunctions *pVVar2;
  long lVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  byte bVar6;
  undefined1 in_stack_fffffffffffffce8 [216];
  undefined8 local_208 [27];
  VkBool32 local_130;
  GenericFeatureChain local_128;
  GenericFeatureChain local_110;
  byte local_f5;
  undefined1 local_f4 [7];
  bool required_features_supported;
  VkPhysicalDeviceFeatures actual_pdf;
  VkPhysicalDeviceFeatures *features_to_enable_local;
  PhysicalDevice *this_local;
  
  bVar6 = 0;
  actual_pdf._212_8_ = features_to_enable;
  memset(local_f4,0,0xdc);
  pVVar2 = detail::vulkan_functions();
  (*pVVar2->fp_vkGetPhysicalDeviceFeatures)
            (this->physical_device,(VkPhysicalDeviceFeatures *)local_f4);
  requested = actual_pdf._212_8_;
  memset(&local_110,0,0x18);
  std::
  vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
  ::vector(&local_110.nodes);
  memset(&local_128,0,0x18);
  std::
  vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
  ::vector(&local_128.nodes);
  bVar1 = detail::supports_features
                    ((VkPhysicalDeviceFeatures *)local_f4,(VkPhysicalDeviceFeatures *)requested,
                     &local_110,&local_128);
  detail::GenericFeatureChain::~GenericFeatureChain(&local_128);
  detail::GenericFeatureChain::~GenericFeatureChain(&local_110);
  local_f5 = bVar1;
  if (bVar1) {
    memcpy(local_208,(void *)actual_pdf._212_8_,0xdc);
    puVar4 = local_208;
    puVar5 = (undefined8 *)&stack0xfffffffffffffce8;
    for (lVar3 = 0x1b; lVar3 != 0; lVar3 = lVar3 + -1) {
      *puVar5 = *puVar4;
      puVar4 = puVar4 + (ulong)bVar6 * -2 + 1;
      puVar5 = puVar5 + (ulong)bVar6 * -2 + 1;
    }
    src.inheritedQueries = local_130;
    src.robustBufferAccess = in_stack_fffffffffffffce8._0_4_;
    src.fullDrawIndexUint32 = in_stack_fffffffffffffce8._4_4_;
    src.imageCubeArray = in_stack_fffffffffffffce8._8_4_;
    src.independentBlend = in_stack_fffffffffffffce8._12_4_;
    src.geometryShader = in_stack_fffffffffffffce8._16_4_;
    src.tessellationShader = in_stack_fffffffffffffce8._20_4_;
    src.sampleRateShading = in_stack_fffffffffffffce8._24_4_;
    src.dualSrcBlend = in_stack_fffffffffffffce8._28_4_;
    src.logicOp = in_stack_fffffffffffffce8._32_4_;
    src.multiDrawIndirect = in_stack_fffffffffffffce8._36_4_;
    src.drawIndirectFirstInstance = in_stack_fffffffffffffce8._40_4_;
    src.depthClamp = in_stack_fffffffffffffce8._44_4_;
    src.depthBiasClamp = in_stack_fffffffffffffce8._48_4_;
    src.fillModeNonSolid = in_stack_fffffffffffffce8._52_4_;
    src.depthBounds = in_stack_fffffffffffffce8._56_4_;
    src.wideLines = in_stack_fffffffffffffce8._60_4_;
    src.largePoints = in_stack_fffffffffffffce8._64_4_;
    src.alphaToOne = in_stack_fffffffffffffce8._68_4_;
    src.multiViewport = in_stack_fffffffffffffce8._72_4_;
    src.samplerAnisotropy = in_stack_fffffffffffffce8._76_4_;
    src.textureCompressionETC2 = in_stack_fffffffffffffce8._80_4_;
    src.textureCompressionASTC_LDR = in_stack_fffffffffffffce8._84_4_;
    src.textureCompressionBC = in_stack_fffffffffffffce8._88_4_;
    src.occlusionQueryPrecise = in_stack_fffffffffffffce8._92_4_;
    src.pipelineStatisticsQuery = in_stack_fffffffffffffce8._96_4_;
    src.vertexPipelineStoresAndAtomics = in_stack_fffffffffffffce8._100_4_;
    src.fragmentStoresAndAtomics = in_stack_fffffffffffffce8._104_4_;
    src.shaderTessellationAndGeometryPointSize = in_stack_fffffffffffffce8._108_4_;
    src.shaderImageGatherExtended = in_stack_fffffffffffffce8._112_4_;
    src.shaderStorageImageExtendedFormats = in_stack_fffffffffffffce8._116_4_;
    src.shaderStorageImageMultisample = in_stack_fffffffffffffce8._120_4_;
    src.shaderStorageImageReadWithoutFormat = in_stack_fffffffffffffce8._124_4_;
    src.shaderStorageImageWriteWithoutFormat = in_stack_fffffffffffffce8._128_4_;
    src.shaderUniformBufferArrayDynamicIndexing = in_stack_fffffffffffffce8._132_4_;
    src.shaderSampledImageArrayDynamicIndexing = in_stack_fffffffffffffce8._136_4_;
    src.shaderStorageBufferArrayDynamicIndexing = in_stack_fffffffffffffce8._140_4_;
    src.shaderStorageImageArrayDynamicIndexing = in_stack_fffffffffffffce8._144_4_;
    src.shaderClipDistance = in_stack_fffffffffffffce8._148_4_;
    src.shaderCullDistance = in_stack_fffffffffffffce8._152_4_;
    src.shaderFloat64 = in_stack_fffffffffffffce8._156_4_;
    src.shaderInt64 = in_stack_fffffffffffffce8._160_4_;
    src.shaderInt16 = in_stack_fffffffffffffce8._164_4_;
    src.shaderResourceResidency = in_stack_fffffffffffffce8._168_4_;
    src.shaderResourceMinLod = in_stack_fffffffffffffce8._172_4_;
    src.sparseBinding = in_stack_fffffffffffffce8._176_4_;
    src.sparseResidencyBuffer = in_stack_fffffffffffffce8._180_4_;
    src.sparseResidencyImage2D = in_stack_fffffffffffffce8._184_4_;
    src.sparseResidencyImage3D = in_stack_fffffffffffffce8._188_4_;
    src.sparseResidency2Samples = in_stack_fffffffffffffce8._192_4_;
    src.sparseResidency4Samples = in_stack_fffffffffffffce8._196_4_;
    src.sparseResidency8Samples = in_stack_fffffffffffffce8._200_4_;
    src.sparseResidency16Samples = in_stack_fffffffffffffce8._204_4_;
    src.sparseResidencyAliased = in_stack_fffffffffffffce8._208_4_;
    src.variableMultisampleRate = in_stack_fffffffffffffce8._212_4_;
    detail::combine_features(&this->features,src);
  }
  return (bool)(local_f5 & 1);
}

Assistant:

bool PhysicalDevice::enable_features_if_present(const VkPhysicalDeviceFeatures& features_to_enable) {
    VkPhysicalDeviceFeatures actual_pdf{};
    detail::vulkan_functions().fp_vkGetPhysicalDeviceFeatures(physical_device, &actual_pdf);

    bool required_features_supported = detail::supports_features(actual_pdf, features_to_enable, {}, {});
    if (required_features_supported) {
        detail::combine_features(features, features_to_enable);
    }
    return required_features_supported;
}